

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marry.c
# Opt level: O1

uint16_t nuts_next_port(void)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  time_t tVar4;
  char *__filename;
  uint local_24;
  ushort local_1e;
  uint seed;
  uint16_t end;
  uint16_t base;
  uint16_t port;
  
  pcVar3 = getenv("NUTS_PORT_FILE");
  __filename = ".nuts_ports";
  if (pcVar3 != (char *)0x0) {
    __filename = pcVar3;
  }
  pcVar3 = getenv("NUTS_PORT_RANGE");
  if (((pcVar3 == (char *)0x0) ||
      (iVar2 = __isoc99_sscanf(pcVar3,"%hu:%hu",&seed,&local_1e), iVar2 != 1)) ||
     (local_1e <= (ushort)seed)) {
    seed._0_2_ = 38000;
    local_1e = 40000;
  }
  __stream = fopen(__filename,"r+");
  if ((__stream != (FILE *)0x0) || (__stream = fopen(__filename,"w+"), __stream != (FILE *)0x0)) {
    fseek(__stream,0,0);
    iVar2 = fileno(__stream);
    iVar2 = lockf(iVar2,0,1);
    if (iVar2 == 0) {
      iVar2 = __isoc99_fscanf(__stream,"%hu",(long)&seed + 2);
      if (iVar2 != 1) {
        tVar4 = time((time_t *)0x0);
        uVar1 = (ushort)seed;
        local_24 = (uint)tVar4;
        iVar2 = rand_r(&local_24);
        seed._2_2_ = (short)(iVar2 % (int)((uint)local_1e - (uint)(ushort)seed)) + uVar1;
      }
      seed._2_2_ = seed._2_2_ + 1;
      if ((seed._2_2_ < (ushort)seed) || ((uint)local_1e + (uint)(ushort)seed <= (uint)seed._2_2_))
      {
        seed._2_2_ = (ushort)seed;
      }
      fseek(__stream,0,0);
      iVar2 = fileno(__stream);
      iVar2 = ftruncate(iVar2,0);
      if (iVar2 == 0) {
        fprintf(__stream,"%u",(ulong)seed._2_2_);
        iVar2 = fileno(__stream);
        lockf(iVar2,0,0);
        fclose(__stream);
        return seed._2_2_;
      }
    }
    fclose(__stream);
  }
  return 0;
}

Assistant:

uint16_t
nuts_next_port(void)
{
	char    *name;
	FILE    *f;
	uint16_t port;
	uint16_t base;
	uint16_t end;
	char    *str;
#ifdef _WIN32
	OVERLAPPED olp;
	HANDLE     h;
#endif

	if ((name = getenv("NUTS_PORT_FILE")) == NULL) {
		name = ".nuts_ports";
	}
	if (((str = getenv("NUTS_PORT_RANGE")) == NULL) ||
	    ((sscanf(str, "%hu:%hu", &base, &end)) != 1) ||
	    ((int) end - (int) base) < 1) {
		base = 38000;
		end  = 40000;
	}

	if (((f = fopen(name, "r+")) == NULL) &&
	    ((f = fopen(name, "w+")) == NULL)) {
		return (0);
	}
	(void) fseek(f, 0, SEEK_SET);

#ifdef _WIN32
	h = (HANDLE) _get_osfhandle(_fileno(f));

	// This contains the offset information for LockFileEx.
	ZeroMemory(&olp, sizeof(olp));

	if (LockFileEx(h, LOCKFILE_EXCLUSIVE_LOCK, 0, MAXDWORD, MAXDWORD,
	        &olp) == FALSE) {
		fclose(f);
		return (0);
	}
#else
	if (lockf(fileno(f), 0, F_LOCK) != 0) {
		(void) fclose(f);
		return (0);
	}
#endif
	if (fscanf(f, "%hu", &port) != 1) {
		unsigned seed = (unsigned) time(NULL);

#ifdef _WIN32
		port = base + rand_s(&seed) % (end - base);
#else
		port = base + rand_r(&seed) % (end - base);
#endif
	}
	port++;
	if ((port < base) || (port >= (base + end))) {
		port = base;
	}

#ifdef _WIN32
	fseek(f, 0, SEEK_SET);
	SetEndOfFile(h);
	(void) fprintf(f, "%u", port);
	ZeroMemory(&olp, sizeof(olp));
	(void) UnlockFileEx(h, 0, MAXDWORD, MAXDWORD, &olp);
#else
	fseek(f, 0, SEEK_SET);
	if (ftruncate(fileno(f), 0) != 0) {
		(void) fclose(f);
		return (0);
	}

	(void) fprintf(f, "%u", port);
	(void) lockf(fileno(f), 0, F_ULOCK);

#endif
	(void) fclose(f);
	return (port);
}